

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.cc
# Opt level: O1

event * helix::make_trade_event
                  (event *__return_storage_ptr__,string *symbol,uint64_t timestamp,trade *t,
                  event_mask mask)

{
  pointer pcVar1;
  
  __return_storage_ptr__->_mask = mask | 2;
  (__return_storage_ptr__->_symbol)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->_symbol).field_2;
  pcVar1 = (symbol->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->_symbol,pcVar1,pcVar1 + symbol->_M_string_length);
  __return_storage_ptr__->_timestamp = timestamp;
  __return_storage_ptr__->_ob = (order_book *)0x0;
  __return_storage_ptr__->_trade = t;
  return __return_storage_ptr__;
}

Assistant:

event make_trade_event(const std::string& symbol, uint64_t timestamp, trade* t, event_mask mask)
{
    return event{mask | ev_trade, symbol, timestamp, nullptr, t};
}